

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_semaphore_init(int initialValue,ma_semaphore *pSemaphore)

{
  ma_result mVar1;
  ma_semaphore *pSemaphore_local;
  int initialValue_local;
  
  if (pSemaphore == (ma_semaphore *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/mackron/miniaudio.h"
                  ,0x2a4b,"ma_result ma_semaphore_init(int, ma_semaphore *)");
  }
  mVar1 = ma_semaphore_init__posix(initialValue,pSemaphore);
  return mVar1;
}

Assistant:

MA_API ma_result ma_semaphore_init(int initialValue, ma_semaphore* pSemaphore)
{
    if (pSemaphore == NULL) {
        MA_ASSERT(MA_FALSE);    /* Fire an assert so the caller is aware of this bug. */
        return MA_INVALID_ARGS;
    }

#ifdef MA_WIN32
    return ma_semaphore_init__win32(initialValue, pSemaphore);
#endif
#ifdef MA_POSIX
    return ma_semaphore_init__posix(initialValue, pSemaphore);
#endif
}